

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall absl::flags_internal::FlagImpl::Write(FlagImpl *this,void *src)

{
  flags_internal *this_00;
  bool bVar1;
  Mutex *mu;
  FlagFastTypeId flag_type_id;
  void *__p;
  char *pcVar2;
  void *val;
  AlphaNum *in_R9;
  undefined1 auVar3 [16];
  string_view text;
  AlphaNum local_188;
  AlphaNum local_158;
  string_view local_128;
  AlphaNum local_118;
  AlphaNum local_e8;
  string local_b8;
  int local_98 [2];
  char *local_90;
  char *absl_raw_log_internal_filename;
  size_t local_80;
  undefined1 local_78 [8];
  string src_as_str;
  string ignored_error;
  undefined1 local_30 [8];
  unique_ptr<void,_absl::flags_internal::DynValueDeleter> obj;
  MutexLock l;
  void *src_local;
  FlagImpl *this_local;
  
  mu = DataGuard(this);
  MutexLock::MutexLock
            ((MutexLock *)
             &obj._M_t.super___uniq_ptr_impl<void,_absl::flags_internal::DynValueDeleter>._M_t.
              super__Tuple_impl<0UL,_void_*,_absl::flags_internal::DynValueDeleter>.
              super__Head_base<0UL,_void_*,_false>,mu);
  flag_type_id = FastTypeId(this->op_);
  bVar1 = anon_unknown_23::ShouldValidateFlagValue(flag_type_id);
  if (bVar1) {
    __p = Clone(this->op_,src);
    val = __p;
    DynValueDeleter::DynValueDeleter
              ((DynValueDeleter *)((long)&ignored_error.field_2 + 8),this->op_);
    std::unique_ptr<void,absl::flags_internal::DynValueDeleter>::
    unique_ptr<absl::flags_internal::DynValueDeleter,void>
              ((unique_ptr<void,absl::flags_internal::DynValueDeleter> *)local_30,__p,
               (__enable_if_t<_is_lvalue_reference<DynValueDeleter>::value,_absl::flags_internal::DynValueDeleter_&&>
                )((long)&ignored_error.field_2 + 8));
    std::__cxx11::string::string((string *)(src_as_str.field_2._M_local_buf + 8));
    Unparse_abi_cxx11_((string *)local_78,(flags_internal *)this->op_,(FlagOpFn)src,val);
    this_00 = (flags_internal *)this->op_;
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
    local_80 = auVar3._8_8_;
    absl_raw_log_internal_filename = auVar3._0_8_;
    pcVar2 = (char *)std::unique_ptr<void,_absl::flags_internal::DynValueDeleter>::get
                               ((unique_ptr<void,_absl::flags_internal::DynValueDeleter> *)local_30)
    ;
    text._M_str = pcVar2;
    text._M_len = local_80;
    bVar1 = Parse(this_00,(FlagOpFn)absl_raw_log_internal_filename,text,
                  (void *)((long)&src_as_str.field_2 + 8),(string *)in_R9);
    if (!bVar1) {
      local_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
      ;
      local_98[1] = 2;
      local_98[0] = 0x200;
      AlphaNum::AlphaNum(&local_e8,"Attempt to set flag \'");
      local_128 = Name(this);
      AlphaNum::AlphaNum(&local_118,local_128);
      AlphaNum::AlphaNum(&local_158,"\' to invalid value ");
      AlphaNum::AlphaNum<std::allocator<char>>
                (&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      StrCat_abi_cxx11_(&local_b8,(absl *)&local_e8,&local_118,&local_158,&local_188,in_R9);
      base_internal::
      AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
                ((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                  *)raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_98 + 1)
                 ,&local_90,local_98,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)(src_as_str.field_2._M_local_buf + 8));
    std::unique_ptr<void,_absl::flags_internal::DynValueDeleter>::~unique_ptr
              ((unique_ptr<void,_absl::flags_internal::DynValueDeleter> *)local_30);
  }
  StoreValue(this,src);
  MutexLock::~MutexLock
            ((MutexLock *)
             &obj._M_t.super___uniq_ptr_impl<void,_absl::flags_internal::DynValueDeleter>._M_t.
              super__Tuple_impl<0UL,_void_*,_absl::flags_internal::DynValueDeleter>.
              super__Head_base<0UL,_void_*,_false>);
  return;
}

Assistant:

void FlagImpl::Write(const void* src) {
  absl::MutexLock l(DataGuard());

  if (ShouldValidateFlagValue(flags_internal::FastTypeId(op_))) {
    std::unique_ptr<void, DynValueDeleter> obj{flags_internal::Clone(op_, src),
                                               DynValueDeleter{op_}};
    std::string ignored_error;
    std::string src_as_str = flags_internal::Unparse(op_, src);
    if (!flags_internal::Parse(op_, src_as_str, obj.get(), &ignored_error)) {
      ABSL_INTERNAL_LOG(ERROR, absl::StrCat("Attempt to set flag '", Name(),
                                            "' to invalid value ", src_as_str));
    }
  }

  StoreValue(src);
}